

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O3

void __thiscall
IRBuilderAsmJs::BuildElementSlot
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,int32 slotIndex,RegSlot value,
          RegSlot instance)

{
  code *pcVar1;
  bool bVar2;
  OpCodeAsmJs OVar3;
  uint uVar4;
  RegSlot RVar5;
  undefined4 *puVar6;
  PropertySym *pPVar7;
  SymOpnd *pSVar8;
  SymOpnd *this_00;
  SymOpnd *this_01;
  Instr *instr;
  IndirOpnd *src1Opnd;
  RegOpnd *pRVar9;
  RegOpnd *pRVar10;
  RegOpnd *dstOpnd;
  PropertyKind propertyKind;
  uint uVar11;
  Func *pFVar12;
  Types type;
  OpCode OVar13;
  anon_union_2_4_ea848c7b_for_ValueType_13 *this_02;
  IRType type_00;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  char local_31;
  ValueType valueType;
  
  bVar2 = OpCodeAttrAsmJs::HasMultiSizeLayout(newOpcode);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x4c9,"(OpCodeAttrAsmJs::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttrAsmJs::HasMultiSizeLayout(newOpcode)");
    if (!bVar2) goto LAB_004f6267;
    *puVar6 = 0;
  }
  if (1 < (ushort)(newOpcode - LdArr_Func) && instance != 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x4cb,
                       "(instance == 1 || newOpcode == Js::OpCodeAsmJs::LdArr_Func || newOpcode == Js::OpCodeAsmJs::LdArr_WasmFunc)"
                       ,
                       "instance == 1 || newOpcode == Js::OpCodeAsmJs::LdArr_Func || newOpcode == Js::OpCodeAsmJs::LdArr_WasmFunc"
                      );
    if (!bVar2) goto LAB_004f6267;
    *puVar6 = 0;
  }
  this_02 = &local_34;
  ValueType::ValueType((ValueType *)&this_02->field_0);
  uVar4 = (uint)newOpcode;
  if (Simd128_Ld_F4 < newOpcode) {
    if (uVar4 == 0x1e4 || newOpcode < Simd128_Ld_I16) {
      switch(newOpcode) {
      case Simd128_StSlot_I8:
switchD_004f5e17_caseD_18c:
        type_00 = TySimd128I8;
        OVar3 = Simd128_StSlot_I8;
        break;
      case Simd128_LdSlot_U4:
      case Simd128_StSlot_U4:
        type_00 = TySimd128U4;
        OVar3 = Simd128_StSlot_U4;
        break;
      case Simd128_LdSlot_U8:
      case Simd128_StSlot_U8:
        type_00 = TySimd128U8;
        OVar3 = Simd128_StSlot_U8;
        break;
      case Simd128_LdSlot_U16:
      case Simd128_StSlot_U16:
        type_00 = TySimd128U16;
        OVar3 = Simd128_StSlot_U16;
        break;
      default:
        if (1 < uVar4 - 0x141) goto switchD_004f5dc9_default;
        type_00 = TySimd128F4;
        OVar3 = Simd128_StSlot_F4;
      }
    }
    else {
      uVar11 = newOpcode - 0x259;
      if (0x17 < uVar11) {
LAB_004f5f69:
        if (uVar4 == 0x1e5) goto LAB_004f5f74;
        goto switchD_004f5dc9_default;
      }
      if ((3U >> (uVar11 & 0x1f) & 1) == 0) {
        if ((0x6000U >> (uVar11 & 0x1f) & 1) == 0) {
          if ((0xc00000U >> (uVar11 & 0x1f) & 1) == 0) goto LAB_004f5f69;
          type_00 = TySimd128B16;
          OVar3 = Simd128_StSlot_B16;
        }
        else {
          type_00 = TySimd128B8;
          OVar3 = Simd128_StSlot_B8;
        }
      }
      else {
        type_00 = TySimd128B4;
        OVar3 = Simd128_StSlot_B4;
      }
    }
LAB_004f5f7f:
    local_31 = OVar3 == newOpcode;
    local_34.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         GetSimdValueTypeFromIRType((IRBuilderAsmJs *)&this_02->field_0,type_00);
    type = SIMD;
    goto LAB_004f5f99;
  }
  if (uVar4 != 0xec && Simd128_Shuffle_I4 < newOpcode) {
    if (newOpcode - 0xed < 2) {
      type_00 = TySimd128I4;
      OVar3 = Simd128_StSlot_I4;
    }
    else {
      if (uVar4 == 0xf3) goto switchD_004f5e17_caseD_18c;
      if (uVar4 != 0xf7) goto switchD_004f5dc9_default;
LAB_004f5f74:
      type_00 = TySimd128I16;
      OVar3 = Simd128_StSlot_I16;
    }
    goto LAB_004f5f7f;
  }
  switch(uVar4) {
  case 0x4d:
    RVar5 = GetRegSlotFromTypedReg(this,value,INT64);
    propertyKind = PropertyKindSlots;
    goto LAB_004f61ca;
  case 0x4e:
    RVar5 = GetRegSlotFromTypedReg(this,value,INT64);
    propertyKind = PropertyKindSlotArray;
LAB_004f61ca:
    pPVar7 = BuildFieldSym(this,1,slotIndex * 8,propertyKind);
    src1Opnd = (IndirOpnd *)IR::SymOpnd::New(&pPVar7->super_Sym,TyVar,this->m_func);
    pRVar9 = BuildDstOpnd(this,RVar5,TyInt64);
    pFVar12 = this->m_func;
    OVar13 = LdSlot;
LAB_004f6203:
    instr = IR::Instr::New(OVar13,&pRVar9->super_Opnd,&src1Opnd->super_Opnd,pFVar12);
    goto LAB_004f604f;
  case 0x4f:
  case 0x53:
    local_34.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         (anon_union_2_4_ea848c7b_for_ValueType_13)0x108;
    local_31 = newOpcode == StSlot_Db;
    type = FLOAT64;
    type_00 = TyFloat64;
    break;
  case 0x50:
  case 0x54:
    type = INT32;
    local_34.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetInt(false);
    local_31 = newOpcode == StSlot_Int;
    type_00 = TyInt32;
    break;
  case 0x51:
  case 0x55:
    local_34.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetInt(false);
    local_31 = newOpcode == StSlot_Long;
    type = INT64;
    type_00 = TyInt64;
    break;
  case 0x52:
  case 0x56:
    local_34.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         (anon_union_2_4_ea848c7b_for_ValueType_13)0x108;
    local_31 = newOpcode == StSlot_Flt;
    type = FLOAT32;
    type_00 = TyFloat32;
    break;
  case 0x57:
    RVar5 = GetRegSlotFromTypedReg(this,instance,INT64);
    pRVar9 = BuildSrcOpnd(this,RVar5,TyInt64);
    RVar5 = GetRegSlotFromTypedReg(this,slotIndex,INT32);
    pRVar10 = BuildSrcOpnd(this,RVar5,TyUint32);
    src1Opnd = IR::IndirOpnd::New(pRVar9,pRVar10,TyInt64,this->m_func);
    RVar5 = GetRegSlotFromTypedReg(this,value,INT64);
    pRVar9 = BuildDstOpnd(this,RVar5,TyInt64);
    pFVar12 = this->m_func;
    OVar13 = LdAsmJsFunc;
    goto LAB_004f6203;
  case 0x58:
    RVar5 = GetRegSlotFromTypedReg(this,instance,INT64);
    pRVar9 = BuildSrcOpnd(this,RVar5,TyInt64);
    RVar5 = GetRegSlotFromTypedReg(this,slotIndex,INT32);
    pRVar10 = BuildSrcOpnd(this,RVar5,TyUint32);
    RVar5 = GetRegSlotFromTypedReg(this,value,INT64);
    dstOpnd = BuildDstOpnd(this,RVar5,TyInt64);
    instr = IR::Instr::New(LdWasmFunc,&dstOpnd->super_Opnd,&pRVar9->super_Opnd,&pRVar10->super_Opnd,
                           this->m_func);
    goto LAB_004f604f;
  default:
switchD_004f5dc9_default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x55a,"((0))","(0)");
    if (!bVar2) {
LAB_004f6267:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
    instr = (Instr *)0x0;
    goto LAB_004f604f;
  }
LAB_004f5f99:
  RVar5 = GetRegSlotFromTypedReg(this,value,type);
  pPVar7 = BuildFieldSym(this,1,slotIndex * TySize[type_00],PropertyKindSlots);
  pSVar8 = IR::SymOpnd::New(&pPVar7->super_Sym,type_00,this->m_func);
  if (local_31 == '\0') {
    this_01 = (SymOpnd *)BuildDstOpnd(this,RVar5,type_00);
    IR::Opnd::SetValueType((Opnd *)this_01,(ValueType)local_34.field_0);
    pFVar12 = this->m_func;
    OVar13 = LdSlot;
    this_00 = pSVar8;
  }
  else {
    this_00 = (SymOpnd *)BuildSrcOpnd(this,RVar5,type_00);
    IR::Opnd::SetValueType((Opnd *)this_00,(ValueType)local_34.field_0);
    pFVar12 = this->m_func;
    OVar13 = StSlot;
    this_01 = pSVar8;
  }
  instr = IR::Instr::New(OVar13,&this_01->super_Opnd,&this_00->super_Opnd,pFVar12);
LAB_004f604f:
  AddInstr(this,instr,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildElementSlot(Js::OpCodeAsmJs newOpcode, uint32 offset, int32 slotIndex, Js::RegSlot value, Js::RegSlot instance)
{
    Assert(OpCodeAttrAsmJs::HasMultiSizeLayout(newOpcode));

    Assert(instance == 1 || newOpcode == Js::OpCodeAsmJs::LdArr_Func || newOpcode == Js::OpCodeAsmJs::LdArr_WasmFunc);

    Js::RegSlot valueRegSlot;
    IR::Opnd * slotOpnd;
    IR::RegOpnd * regOpnd;
    IR::Instr * instr = nullptr;

    WAsmJs::Types type;
    IRType irType;
    ValueType valueType;
    bool isStore = false;

    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::LdSlot:
        valueRegSlot = GetRegSlotFromPtrReg(value);

        slotOpnd = BuildFieldOpnd(AsmJsRegSlots::ModuleMemReg, slotIndex, PropertyKindSlotArray, TyVar);

        regOpnd = BuildDstOpnd(valueRegSlot, TyMachReg);
        instr = IR::Instr::New(Js::OpCode::LdSlot, regOpnd, slotOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::LdSlotArr:
        valueRegSlot = GetRegSlotFromPtrReg(value);

        slotOpnd = BuildFieldOpnd(AsmJsRegSlots::ModuleMemReg, slotIndex, PropertyKindSlots, TyVar);

        regOpnd = BuildDstOpnd(valueRegSlot, TyMachReg);
        instr = IR::Instr::New(Js::OpCode::LdSlot, regOpnd, slotOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::LdArr_Func:
    {
        IR::RegOpnd * baseOpnd = BuildSrcOpnd(GetRegSlotFromPtrReg(instance), TyMachReg);
        IR::RegOpnd * indexOpnd = BuildSrcOpnd(GetRegSlotFromIntReg(slotIndex), TyUint32);

        IR::IndirOpnd * indirOpnd = IR::IndirOpnd::New(baseOpnd, indexOpnd, TyMachReg, m_func);

        regOpnd = BuildDstOpnd(GetRegSlotFromPtrReg(value), TyMachReg);
        instr = IR::Instr::New(Js::OpCode::LdAsmJsFunc, regOpnd, indirOpnd, m_func);
        break;
    }
    case Js::OpCodeAsmJs::LdArr_WasmFunc:
    {
        IR::RegOpnd * baseOpnd = BuildSrcOpnd(GetRegSlotFromPtrReg(instance), TyMachReg);
        IR::RegOpnd * indexOpnd = BuildSrcOpnd(GetRegSlotFromIntReg(slotIndex), TyUint32);

        regOpnd = BuildDstOpnd(GetRegSlotFromPtrReg(value), TyMachReg);
        instr = IR::Instr::New(Js::OpCode::LdWasmFunc, regOpnd, baseOpnd, indexOpnd, m_func);
        break;
    }
    case Js::OpCodeAsmJs::StSlot_Int:
    case Js::OpCodeAsmJs::LdSlot_Int:
        type = WAsmJs::INT32;
        irType = TyInt32;
        valueType = ValueType::GetInt(false);
        isStore = newOpcode == Js::OpCodeAsmJs::StSlot_Int;
        goto ProcessGenericSlot;

    case Js::OpCodeAsmJs::StSlot_Long:
    case Js::OpCodeAsmJs::LdSlot_Long:
        type = WAsmJs::INT64;
        irType = TyInt64;
        valueType = ValueType::GetInt(false);
        isStore = newOpcode == Js::OpCodeAsmJs::StSlot_Long;
        goto ProcessGenericSlot;

    case Js::OpCodeAsmJs::StSlot_Flt:
    case Js::OpCodeAsmJs::LdSlot_Flt:
        type = WAsmJs::FLOAT32;
        irType = TyFloat32;
        valueType = ValueType::Float;
        isStore = newOpcode == Js::OpCodeAsmJs::StSlot_Flt;
        goto ProcessGenericSlot;

    case Js::OpCodeAsmJs::StSlot_Db:
    case Js::OpCodeAsmJs::LdSlot_Db:
        type = WAsmJs::FLOAT64;
        irType = TyFloat64;
        valueType = ValueType::Float;
        isStore = newOpcode == Js::OpCodeAsmJs::StSlot_Db;
        goto ProcessGenericSlot;

    case Js::OpCodeAsmJs::Simd128_StSlot_I4:
    case Js::OpCodeAsmJs::Simd128_LdSlot_I4:
        irType = TySimd128I4;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_I4;
        goto ProcessSimdSlot;
    case Js::OpCodeAsmJs::Simd128_StSlot_B4:
    case Js::OpCodeAsmJs::Simd128_LdSlot_B4:
        irType = TySimd128B4;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_B4;
        goto ProcessSimdSlot;
    case Js::OpCodeAsmJs::Simd128_StSlot_B8:
    case Js::OpCodeAsmJs::Simd128_LdSlot_B8:
        irType = TySimd128B8;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_B8;
        goto ProcessSimdSlot;
    case Js::OpCodeAsmJs::Simd128_StSlot_B16:
    case Js::OpCodeAsmJs::Simd128_LdSlot_B16:
        irType = TySimd128B16;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_B16;
        goto ProcessSimdSlot;
    case Js::OpCodeAsmJs::Simd128_StSlot_F4:
    case Js::OpCodeAsmJs::Simd128_LdSlot_F4:
        irType = TySimd128F4;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_F4;
        goto ProcessSimdSlot;
#if 0
    case Js::OpCodeAsmJs::Simd128_StSlot_D2:
    case Js::OpCodeAsmJs::Simd128_LdSlot_D2:
        irType = TySimd128D2;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_D2;
        goto ProcessSimdSlot;
#endif // 0
    case Js::OpCodeAsmJs::Simd128_StSlot_I8:
    case Js::OpCodeAsmJs::Simd128_LdSlot_I8:
        irType = TySimd128I8;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_I8;
        goto ProcessSimdSlot;
    case Js::OpCodeAsmJs::Simd128_StSlot_I16:
    case Js::OpCodeAsmJs::Simd128_LdSlot_I16:
        irType = TySimd128I16;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_I16;
        goto ProcessSimdSlot;
    case Js::OpCodeAsmJs::Simd128_StSlot_U4:
    case Js::OpCodeAsmJs::Simd128_LdSlot_U4:
        irType = TySimd128U4;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_U4;
        goto ProcessSimdSlot;
    case Js::OpCodeAsmJs::Simd128_StSlot_U8:
    case Js::OpCodeAsmJs::Simd128_LdSlot_U8:
        irType = TySimd128U8;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_U8;
        goto ProcessSimdSlot;
    case Js::OpCodeAsmJs::Simd128_StSlot_U16:
    case Js::OpCodeAsmJs::Simd128_LdSlot_U16:
        irType = TySimd128U16;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_U16;
        goto ProcessSimdSlot;

    default:
        Assume(UNREACHED);
        break;
ProcessSimdSlot:
        type = WAsmJs::SIMD;
        valueType = GetSimdValueTypeFromIRType(irType);
ProcessGenericSlot:
        valueRegSlot = GetRegSlotFromTypedReg(value, type);
        slotOpnd = BuildFieldOpnd(AsmJsRegSlots::ModuleMemReg, slotIndex, PropertyKindSlots, irType);
        if (isStore)
        {
            regOpnd = BuildSrcOpnd(valueRegSlot, irType);
            regOpnd->SetValueType(valueType);
            instr = IR::Instr::New(Js::OpCode::StSlot, slotOpnd, regOpnd, m_func);
        }
        else
        {
            regOpnd = BuildDstOpnd(valueRegSlot, irType);
            regOpnd->SetValueType(valueType);
            instr = IR::Instr::New(Js::OpCode::LdSlot, regOpnd, slotOpnd, m_func);
        }
        break;
    }

    AddInstr(instr, offset);
}